

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaAigerExt.c
# Opt level: O2

Vec_Str_t * Gia_AigerWriteMappingDoc(Gia_Man_t *p)

{
  int iVar1;
  uchar *pPos;
  int *piVar2;
  Vec_Str_t *pVVar3;
  int iVar4;
  int iVar5;
  uchar *pPos_00;
  long lVar6;
  int iVar7;
  int iVar8;
  
  iVar7 = 2;
  iVar5 = 0;
  iVar8 = 0;
  for (iVar4 = 1; iVar4 < p->nObjs; iVar4 = iVar4 + 1) {
    iVar1 = Gia_ObjIsLut(p,iVar4);
    if (iVar1 != 0) {
      iVar5 = iVar5 + 1;
      iVar1 = Gia_ObjLutSize(p,iVar4);
      iVar7 = iVar7 + iVar1 + 2;
      iVar1 = Gia_ObjLutSize(p,iVar4);
      if (iVar8 <= iVar1) {
        iVar8 = iVar1;
      }
    }
  }
  pPos = (uchar *)malloc((long)(iVar7 * 4));
  Gia_AigerWriteInt(pPos,iVar5);
  Gia_AigerWriteInt(pPos + 4,iVar8);
  iVar4 = 2;
  iVar8 = 1;
  while( true ) {
    if (p->nObjs <= iVar8) break;
    iVar5 = Gia_ObjIsLut(p,iVar8);
    if (iVar5 != 0) {
      Gia_AigerWriteInt(pPos + iVar4 * 4,iVar8);
      iVar5 = Gia_ObjLutSize(p,iVar8);
      Gia_AigerWriteInt(pPos + (iVar4 * 4 + 4),iVar5);
      pPos_00 = pPos + (long)(iVar4 + 2) * 4;
      lVar6 = 0;
      while( true ) {
        iVar5 = Gia_ObjLutSize(p,iVar8);
        if (iVar5 <= lVar6) break;
        piVar2 = Gia_ObjLutFanins(p,iVar8);
        Gia_AigerWriteInt(pPos_00,piVar2[lVar6]);
        lVar6 = lVar6 + 1;
        pPos_00 = pPos_00 + 4;
      }
      iVar4 = iVar4 + 2 + (int)lVar6;
    }
    iVar8 = iVar8 + 1;
  }
  if (iVar4 == iVar7) {
    pVVar3 = Vec_StrAllocArray((char *)pPos,iVar7 * 4);
    return pVVar3;
  }
  __assert_fail("nSize2 == nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaAigerExt.c"
                ,0x11f,"Vec_Str_t *Gia_AigerWriteMappingDoc(Gia_Man_t *)");
}

Assistant:

Vec_Str_t * Gia_AigerWriteMappingDoc( Gia_Man_t * p )
{
    unsigned char * pBuffer;
    int i, k, iFan, nLuts = 0, LutSize = 0, nSize = 2, nSize2 = 0;
    Gia_ManForEachLut( p, i )
    {
        nLuts++;
        nSize += Gia_ObjLutSize(p, i) + 2;
        LutSize = Abc_MaxInt( LutSize, Gia_ObjLutSize(p, i) );
    }
    pBuffer = ABC_ALLOC( unsigned char, 4 * nSize );
    Gia_AigerWriteInt( pBuffer + 4 * nSize2++, nLuts );  
    Gia_AigerWriteInt( pBuffer + 4 * nSize2++, LutSize );
    Gia_ManForEachLut( p, i )
    {
        Gia_AigerWriteInt( pBuffer + 4 * nSize2++, i );
        Gia_AigerWriteInt( pBuffer + 4 * nSize2++, Gia_ObjLutSize(p, i) );
        Gia_LutForEachFanin( p, i, iFan, k )
            Gia_AigerWriteInt( pBuffer + 4 * nSize2++, iFan );
    }
    assert( nSize2 == nSize );
    return Vec_StrAllocArray( (char *)pBuffer, 4*nSize );
}